

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cpp
# Opt level: O0

uint8_t * __thiscall llvm::MD5::body(MD5 *this,ArrayRef<unsigned_char> Data)

{
  MD5_u32plus MVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  size_t local_50;
  unsigned_long Size;
  MD5_u32plus saved_d;
  MD5_u32plus saved_c;
  MD5_u32plus saved_b;
  MD5_u32plus saved_a;
  MD5_u32plus d;
  MD5_u32plus c;
  MD5_u32plus b;
  MD5_u32plus a;
  uint8_t *ptr;
  MD5 *this_local;
  ArrayRef<unsigned_char> Data_local;
  
  Data_local.Data = (uchar *)Data.Length;
  this_local = (MD5 *)Data.Data;
  local_50 = ArrayRef<unsigned_char>::size((ArrayRef<unsigned_char> *)&this_local);
  _b = (MD5_u32plus *)ArrayRef<unsigned_char>::data((ArrayRef<unsigned_char> *)&this_local);
  c = this->a;
  d = this->b;
  saved_a = this->c;
  saved_b = this->d;
  do {
    MVar1 = *_b;
    this->block[0] = MVar1;
    uVar2 = (saved_b ^ d & (saved_a ^ saved_b)) + MVar1 + -0x28955b88 + c;
    uVar3 = d + (uVar2 * 0x80 | uVar2 >> 0x19);
    MVar1 = _b[1];
    this->block[1] = MVar1;
    uVar2 = (saved_a ^ uVar3 & (d ^ saved_a)) + MVar1 + -0x173848aa + saved_b;
    uVar4 = uVar3 + (uVar2 * 0x1000 | uVar2 >> 0x14);
    MVar1 = _b[2];
    this->block[2] = MVar1;
    uVar2 = (d ^ uVar4 & (uVar3 ^ d)) + MVar1 + 0x242070db + saved_a;
    uVar5 = uVar4 + (uVar2 * 0x20000 | uVar2 >> 0xf);
    MVar1 = _b[3];
    this->block[3] = MVar1;
    uVar2 = (uVar3 ^ uVar5 & (uVar4 ^ uVar3)) + MVar1 + -0x3e423112 + d;
    uVar2 = uVar5 + (uVar2 * 0x400000 | uVar2 >> 10);
    MVar1 = _b[4];
    this->block[4] = MVar1;
    uVar3 = (uVar4 ^ uVar2 & (uVar5 ^ uVar4)) + MVar1 + -0xa83f051 + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x80 | uVar3 >> 0x19);
    MVar1 = _b[5];
    this->block[5] = MVar1;
    uVar4 = (uVar5 ^ uVar3 & (uVar2 ^ uVar5)) + MVar1 + 0x4787c62a + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x1000 | uVar4 >> 0x14);
    MVar1 = _b[6];
    this->block[6] = MVar1;
    uVar5 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + MVar1 + -0x57cfb9ed + uVar5;
    uVar5 = uVar4 + (uVar5 * 0x20000 | uVar5 >> 0xf);
    MVar1 = _b[7];
    this->block[7] = MVar1;
    uVar2 = (uVar3 ^ uVar5 & (uVar4 ^ uVar3)) + MVar1 + -0x2b96aff + uVar2;
    uVar2 = uVar5 + (uVar2 * 0x400000 | uVar2 >> 10);
    MVar1 = _b[8];
    this->block[8] = MVar1;
    uVar3 = (uVar4 ^ uVar2 & (uVar5 ^ uVar4)) + MVar1 + 0x698098d8 + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x80 | uVar3 >> 0x19);
    MVar1 = _b[9];
    this->block[9] = MVar1;
    uVar4 = (uVar5 ^ uVar3 & (uVar2 ^ uVar5)) + MVar1 + -0x74bb0851 + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x1000 | uVar4 >> 0x14);
    MVar1 = _b[10];
    this->block[10] = MVar1;
    uVar5 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + MVar1 + -0xa44f + uVar5;
    uVar5 = uVar4 + (uVar5 * 0x20000 | uVar5 >> 0xf);
    MVar1 = _b[0xb];
    this->block[0xb] = MVar1;
    uVar2 = (uVar3 ^ uVar5 & (uVar4 ^ uVar3)) + MVar1 + -0x76a32842 + uVar2;
    uVar2 = uVar5 + (uVar2 * 0x400000 | uVar2 >> 10);
    MVar1 = _b[0xc];
    this->block[0xc] = MVar1;
    uVar3 = (uVar4 ^ uVar2 & (uVar5 ^ uVar4)) + MVar1 + 0x6b901122 + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x80 | uVar3 >> 0x19);
    MVar1 = _b[0xd];
    this->block[0xd] = MVar1;
    uVar4 = (uVar5 ^ uVar3 & (uVar2 ^ uVar5)) + MVar1 + -0x2678e6d + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x1000 | uVar4 >> 0x14);
    MVar1 = _b[0xe];
    this->block[0xe] = MVar1;
    uVar5 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + MVar1 + -0x5986bc72 + uVar5;
    uVar5 = uVar4 + (uVar5 * 0x20000 | uVar5 >> 0xf);
    MVar1 = _b[0xf];
    this->block[0xf] = MVar1;
    uVar2 = (uVar3 ^ uVar5 & (uVar4 ^ uVar3)) + MVar1 + 0x49b40821 + uVar2;
    uVar2 = uVar5 + (uVar2 * 0x400000 | uVar2 >> 10);
    uVar3 = (uVar5 ^ uVar4 & (uVar2 ^ uVar5)) + this->block[1] + -0x9e1da9e + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x20 | uVar3 >> 0x1b);
    uVar4 = (uVar2 ^ uVar5 & (uVar3 ^ uVar2)) + this->block[6] + -0x3fbf4cc0 + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x200 | uVar4 >> 0x17);
    uVar5 = (uVar3 ^ uVar2 & (uVar4 ^ uVar3)) + this->block[0xb] + 0x265e5a51 + uVar5;
    uVar5 = uVar4 + (uVar5 * 0x4000 | uVar5 >> 0x12);
    uVar2 = (uVar4 ^ uVar3 & (uVar5 ^ uVar4)) + this->block[0] + -0x16493856 + uVar2;
    uVar2 = uVar5 + (uVar2 * 0x100000 | uVar2 >> 0xc);
    uVar3 = (uVar5 ^ uVar4 & (uVar2 ^ uVar5)) + this->block[5] + -0x29d0efa3 + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x20 | uVar3 >> 0x1b);
    uVar4 = (uVar2 ^ uVar5 & (uVar3 ^ uVar2)) + this->block[10] + 0x2441453 + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x200 | uVar4 >> 0x17);
    uVar5 = (uVar3 ^ uVar2 & (uVar4 ^ uVar3)) + this->block[0xf] + -0x275e197f + uVar5;
    uVar5 = uVar4 + (uVar5 * 0x4000 | uVar5 >> 0x12);
    uVar2 = (uVar4 ^ uVar3 & (uVar5 ^ uVar4)) + this->block[4] + -0x182c0438 + uVar2;
    uVar2 = uVar5 + (uVar2 * 0x100000 | uVar2 >> 0xc);
    uVar3 = (uVar5 ^ uVar4 & (uVar2 ^ uVar5)) + this->block[9] + 0x21e1cde6 + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x20 | uVar3 >> 0x1b);
    uVar4 = (uVar2 ^ uVar5 & (uVar3 ^ uVar2)) + this->block[0xe] + -0x3cc8f82a + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x200 | uVar4 >> 0x17);
    uVar5 = (uVar3 ^ uVar2 & (uVar4 ^ uVar3)) + this->block[3] + -0xb2af279 + uVar5;
    uVar5 = uVar4 + (uVar5 * 0x4000 | uVar5 >> 0x12);
    uVar2 = (uVar4 ^ uVar3 & (uVar5 ^ uVar4)) + this->block[8] + 0x455a14ed + uVar2;
    uVar2 = uVar5 + (uVar2 * 0x100000 | uVar2 >> 0xc);
    uVar3 = (uVar5 ^ uVar4 & (uVar2 ^ uVar5)) + this->block[0xd] + -0x561c16fb + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x20 | uVar3 >> 0x1b);
    uVar4 = (uVar2 ^ uVar5 & (uVar3 ^ uVar2)) + this->block[2] + -0x3105c08 + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x200 | uVar4 >> 0x17);
    uVar5 = (uVar3 ^ uVar2 & (uVar4 ^ uVar3)) + this->block[7] + 0x676f02d9 + uVar5;
    uVar5 = uVar4 + (uVar5 * 0x4000 | uVar5 >> 0x12);
    uVar2 = (uVar4 ^ uVar3 & (uVar5 ^ uVar4)) + this->block[0xc] + -0x72d5b376 + uVar2;
    uVar2 = uVar5 + (uVar2 * 0x100000 | uVar2 >> 0xc);
    uVar3 = (uVar2 ^ uVar5 ^ uVar4) + this->block[5] + -0x5c6be + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x10 | uVar3 >> 0x1c);
    uVar4 = (uVar3 ^ uVar2 ^ uVar5) + this->block[8] + -0x788e097f + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x800 | uVar4 >> 0x15);
    uVar5 = (uVar4 ^ uVar3 ^ uVar2) + this->block[0xb] + 0x6d9d6122 + uVar5;
    uVar5 = uVar4 + (uVar5 * 0x10000 | uVar5 >> 0x10);
    uVar2 = (uVar5 ^ uVar4 ^ uVar3) + this->block[0xe] + -0x21ac7f4 + uVar2;
    uVar2 = uVar5 + (uVar2 * 0x800000 | uVar2 >> 9);
    uVar3 = (uVar2 ^ uVar5 ^ uVar4) + this->block[1] + -0x5b4115bc + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x10 | uVar3 >> 0x1c);
    uVar4 = (uVar3 ^ uVar2 ^ uVar5) + this->block[4] + 0x4bdecfa9 + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x800 | uVar4 >> 0x15);
    uVar5 = (uVar4 ^ uVar3 ^ uVar2) + this->block[7] + -0x944b4a0 + uVar5;
    uVar5 = uVar4 + (uVar5 * 0x10000 | uVar5 >> 0x10);
    uVar2 = (uVar5 ^ uVar4 ^ uVar3) + this->block[10] + -0x41404390 + uVar2;
    uVar2 = uVar5 + (uVar2 * 0x800000 | uVar2 >> 9);
    uVar3 = (uVar2 ^ uVar5 ^ uVar4) + this->block[0xd] + 0x289b7ec6 + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x10 | uVar3 >> 0x1c);
    uVar4 = (uVar3 ^ uVar2 ^ uVar5) + this->block[0] + -0x155ed806 + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x800 | uVar4 >> 0x15);
    uVar5 = (uVar4 ^ uVar3 ^ uVar2) + this->block[3] + -0x2b10cf7b + uVar5;
    uVar5 = uVar4 + (uVar5 * 0x10000 | uVar5 >> 0x10);
    uVar2 = (uVar5 ^ uVar4 ^ uVar3) + this->block[6] + 0x4881d05 + uVar2;
    uVar2 = uVar5 + (uVar2 * 0x800000 | uVar2 >> 9);
    uVar3 = (uVar2 ^ uVar5 ^ uVar4) + this->block[9] + -0x262b2fc7 + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x10 | uVar3 >> 0x1c);
    uVar4 = (uVar3 ^ uVar2 ^ uVar5) + this->block[0xc] + -0x1924661b + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x800 | uVar4 >> 0x15);
    uVar5 = (uVar4 ^ uVar3 ^ uVar2) + this->block[0xf] + 0x1fa27cf8 + uVar5;
    uVar5 = uVar4 + (uVar5 * 0x10000 | uVar5 >> 0x10);
    uVar2 = (uVar5 ^ uVar4 ^ uVar3) + this->block[2] + -0x3b53a99b + uVar2;
    uVar2 = uVar5 + (uVar2 * 0x800000 | uVar2 >> 9);
    uVar3 = (uVar5 ^ (uVar2 | uVar4 ^ 0xffffffff)) + this->block[0] + -0xbd6ddbc + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x40 | uVar3 >> 0x1a);
    uVar4 = (uVar2 ^ (uVar3 | uVar5 ^ 0xffffffff)) + this->block[7] + 0x432aff97 + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x400 | uVar4 >> 0x16);
    uVar5 = (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + this->block[0xe] + -0x546bdc59 + uVar5;
    uVar5 = uVar4 + (uVar5 * 0x8000 | uVar5 >> 0x11);
    uVar2 = (uVar4 ^ (uVar5 | uVar3 ^ 0xffffffff)) + this->block[5] + -0x36c5fc7 + uVar2;
    uVar2 = uVar5 + (uVar2 * 0x200000 | uVar2 >> 0xb);
    uVar3 = (uVar5 ^ (uVar2 | uVar4 ^ 0xffffffff)) + this->block[0xc] + 0x655b59c3 + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x40 | uVar3 >> 0x1a);
    uVar4 = (uVar2 ^ (uVar3 | uVar5 ^ 0xffffffff)) + this->block[3] + -0x70f3336e + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x400 | uVar4 >> 0x16);
    uVar5 = (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + this->block[10] + -0x100b83 + uVar5;
    uVar5 = uVar4 + (uVar5 * 0x8000 | uVar5 >> 0x11);
    uVar2 = (uVar4 ^ (uVar5 | uVar3 ^ 0xffffffff)) + this->block[1] + -0x7a7ba22f + uVar2;
    uVar2 = uVar5 + (uVar2 * 0x200000 | uVar2 >> 0xb);
    uVar3 = (uVar5 ^ (uVar2 | uVar4 ^ 0xffffffff)) + this->block[8] + 0x6fa87e4f + uVar3;
    uVar3 = uVar2 + (uVar3 * 0x40 | uVar3 >> 0x1a);
    uVar4 = (uVar2 ^ (uVar3 | uVar5 ^ 0xffffffff)) + this->block[0xf] + -0x1d31920 + uVar4;
    uVar4 = uVar3 + (uVar4 * 0x400 | uVar4 >> 0x16);
    uVar5 = (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + this->block[6] + -0x5cfebcec + uVar5;
    uVar5 = uVar4 + (uVar5 * 0x8000 | uVar5 >> 0x11);
    uVar2 = (uVar4 ^ (uVar5 | uVar3 ^ 0xffffffff)) + this->block[0xd] + 0x4e0811a1 + uVar2;
    uVar6 = uVar5 + (uVar2 * 0x200000 | uVar2 >> 0xb);
    uVar3 = (uVar5 ^ (uVar6 | uVar4 ^ 0xffffffff)) + this->block[4] + -0x8ac817e + uVar3;
    uVar2 = uVar6 + (uVar3 * 0x40 | uVar3 >> 0x1a);
    uVar4 = (uVar6 ^ (uVar2 | uVar5 ^ 0xffffffff)) + this->block[0xb] + -0x42c50dcb + uVar4;
    uVar3 = uVar2 + (uVar4 * 0x400 | uVar4 >> 0x16);
    uVar5 = (uVar2 ^ (uVar3 | uVar6 ^ 0xffffffff)) + this->block[2] + 0x2ad7d2bb + uVar5;
    uVar4 = uVar3 + (uVar5 * 0x8000 | uVar5 >> 0x11);
    uVar6 = (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + this->block[9] + -0x14792c6f + uVar6;
    c = c + uVar2;
    d = d + uVar4 + (uVar6 * 0x200000 | uVar6 >> 0xb);
    saved_a = saved_a + uVar4;
    saved_b = saved_b + uVar3;
    _b = _b + 0x10;
    local_50 = local_50 - 0x40;
  } while (local_50 != 0);
  this->a = c;
  this->b = d;
  this->c = saved_a;
  this->d = saved_b;
  return (uint8_t *)_b;
}

Assistant:

const uint8_t *MD5::body(ArrayRef<uint8_t> Data) {
  const uint8_t *ptr;
  MD5_u32plus a, b, c, d;
  MD5_u32plus saved_a, saved_b, saved_c, saved_d;
  unsigned long Size = Data.size();

  ptr = Data.data();

  a = this->a;
  b = this->b;
  c = this->c;
  d = this->d;

  do {
    saved_a = a;
    saved_b = b;
    saved_c = c;
    saved_d = d;

    // Round 1
    STEP(F, a, b, c, d, SET(0), 0xd76aa478, 7)
    STEP(F, d, a, b, c, SET(1), 0xe8c7b756, 12)
    STEP(F, c, d, a, b, SET(2), 0x242070db, 17)
    STEP(F, b, c, d, a, SET(3), 0xc1bdceee, 22)
    STEP(F, a, b, c, d, SET(4), 0xf57c0faf, 7)
    STEP(F, d, a, b, c, SET(5), 0x4787c62a, 12)
    STEP(F, c, d, a, b, SET(6), 0xa8304613, 17)
    STEP(F, b, c, d, a, SET(7), 0xfd469501, 22)
    STEP(F, a, b, c, d, SET(8), 0x698098d8, 7)
    STEP(F, d, a, b, c, SET(9), 0x8b44f7af, 12)
    STEP(F, c, d, a, b, SET(10), 0xffff5bb1, 17)
    STEP(F, b, c, d, a, SET(11), 0x895cd7be, 22)
    STEP(F, a, b, c, d, SET(12), 0x6b901122, 7)
    STEP(F, d, a, b, c, SET(13), 0xfd987193, 12)
    STEP(F, c, d, a, b, SET(14), 0xa679438e, 17)
    STEP(F, b, c, d, a, SET(15), 0x49b40821, 22)

    // Round 2
    STEP(G, a, b, c, d, GET(1), 0xf61e2562, 5)
    STEP(G, d, a, b, c, GET(6), 0xc040b340, 9)
    STEP(G, c, d, a, b, GET(11), 0x265e5a51, 14)
    STEP(G, b, c, d, a, GET(0), 0xe9b6c7aa, 20)
    STEP(G, a, b, c, d, GET(5), 0xd62f105d, 5)
    STEP(G, d, a, b, c, GET(10), 0x02441453, 9)
    STEP(G, c, d, a, b, GET(15), 0xd8a1e681, 14)
    STEP(G, b, c, d, a, GET(4), 0xe7d3fbc8, 20)
    STEP(G, a, b, c, d, GET(9), 0x21e1cde6, 5)
    STEP(G, d, a, b, c, GET(14), 0xc33707d6, 9)
    STEP(G, c, d, a, b, GET(3), 0xf4d50d87, 14)
    STEP(G, b, c, d, a, GET(8), 0x455a14ed, 20)
    STEP(G, a, b, c, d, GET(13), 0xa9e3e905, 5)
    STEP(G, d, a, b, c, GET(2), 0xfcefa3f8, 9)
    STEP(G, c, d, a, b, GET(7), 0x676f02d9, 14)
    STEP(G, b, c, d, a, GET(12), 0x8d2a4c8a, 20)

    // Round 3
    STEP(H, a, b, c, d, GET(5), 0xfffa3942, 4)
    STEP(H, d, a, b, c, GET(8), 0x8771f681, 11)
    STEP(H, c, d, a, b, GET(11), 0x6d9d6122, 16)
    STEP(H, b, c, d, a, GET(14), 0xfde5380c, 23)
    STEP(H, a, b, c, d, GET(1), 0xa4beea44, 4)
    STEP(H, d, a, b, c, GET(4), 0x4bdecfa9, 11)
    STEP(H, c, d, a, b, GET(7), 0xf6bb4b60, 16)
    STEP(H, b, c, d, a, GET(10), 0xbebfbc70, 23)
    STEP(H, a, b, c, d, GET(13), 0x289b7ec6, 4)
    STEP(H, d, a, b, c, GET(0), 0xeaa127fa, 11)
    STEP(H, c, d, a, b, GET(3), 0xd4ef3085, 16)
    STEP(H, b, c, d, a, GET(6), 0x04881d05, 23)
    STEP(H, a, b, c, d, GET(9), 0xd9d4d039, 4)
    STEP(H, d, a, b, c, GET(12), 0xe6db99e5, 11)
    STEP(H, c, d, a, b, GET(15), 0x1fa27cf8, 16)
    STEP(H, b, c, d, a, GET(2), 0xc4ac5665, 23)

    // Round 4
    STEP(I, a, b, c, d, GET(0), 0xf4292244, 6)
    STEP(I, d, a, b, c, GET(7), 0x432aff97, 10)
    STEP(I, c, d, a, b, GET(14), 0xab9423a7, 15)
    STEP(I, b, c, d, a, GET(5), 0xfc93a039, 21)
    STEP(I, a, b, c, d, GET(12), 0x655b59c3, 6)
    STEP(I, d, a, b, c, GET(3), 0x8f0ccc92, 10)
    STEP(I, c, d, a, b, GET(10), 0xffeff47d, 15)
    STEP(I, b, c, d, a, GET(1), 0x85845dd1, 21)
    STEP(I, a, b, c, d, GET(8), 0x6fa87e4f, 6)
    STEP(I, d, a, b, c, GET(15), 0xfe2ce6e0, 10)
    STEP(I, c, d, a, b, GET(6), 0xa3014314, 15)
    STEP(I, b, c, d, a, GET(13), 0x4e0811a1, 21)
    STEP(I, a, b, c, d, GET(4), 0xf7537e82, 6)
    STEP(I, d, a, b, c, GET(11), 0xbd3af235, 10)
    STEP(I, c, d, a, b, GET(2), 0x2ad7d2bb, 15)
    STEP(I, b, c, d, a, GET(9), 0xeb86d391, 21)

    a += saved_a;
    b += saved_b;
    c += saved_c;
    d += saved_d;

    ptr += 64;
  } while (Size -= 64);

  this->a = a;
  this->b = b;
  this->c = c;
  this->d = d;

  return ptr;
}